

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall
FuncBailOutData::Initialize(FuncBailOutData *this,Func *func,JitArenaAllocator *tempAllocator)

{
  code *pcVar1;
  bool bVar2;
  RegSlot length;
  BOOL BVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  int *__s;
  BVFixed *pBVar5;
  ulong uVar6;
  size_t requestedBytes;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  length = JITTimeFunctionBody::GetLocalsCount(this_00);
  this->func = func;
  if (length == 0) {
    __s = (int *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0058483e;
      *puVar4 = 0;
    }
    uVar6 = (ulong)length;
    requestedBytes = uVar6 * 4;
    __s = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )tempAllocator,requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar6,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar6 * -4);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0058483e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      __s = (int *)0x0;
    }
  }
  this->localOffsets = __s;
  pBVar5 = BVFixed::New<Memory::JitArenaAllocator>(length,tempAllocator,false);
  this->losslessInt32Syms = pBVar5;
  pBVar5 = BVFixed::New<Memory::JitArenaAllocator>(length,tempAllocator,false);
  this->float64Syms = pBVar5;
  return;
}

Assistant:

void
FuncBailOutData::Initialize(Func * func, JitArenaAllocator * tempAllocator)
{
    Js::RegSlot localsCount = func->GetJITFunctionBody()->GetLocalsCount();
    this->func = func;
    this->localOffsets = AnewArrayZ(tempAllocator, int, localsCount);
    this->losslessInt32Syms = BVFixed::New(localsCount, tempAllocator);
    this->float64Syms = BVFixed::New(localsCount, tempAllocator);
}